

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

int Abs_GiaCofPrint(word *pTruth,int nSize,int nSize0,int Res)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int Mark [2];
  
  bVar1 = (byte)nSize & 0x1f;
  uVar3 = 1 << bVar1;
  Mark[0] = 1;
  Mark[1] = 1;
  if (1 << bVar1 < 1) {
    uVar3 = 0;
  }
  uVar2 = 0;
  do {
    if (uVar3 == uVar2) {
      putchar(10);
      if ((Res == 0) && ((Mark[0] == 0 || (Mark[1] == 0)))) {
        __assert_fail("Res || (Mark[0] && Mark[1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                      ,0x265,"int Abs_GiaCofPrint(word *, int, int, int)");
      }
      return 1;
    }
    if ((uVar2 & ~(-1 << ((byte)nSize0 & 0x1f))) == 0) {
      putchar(0x20);
      if ((Res == 0) && ((Mark[0] == 0 || (Mark[1] == 0)))) {
        __assert_fail("Res || (Mark[0] && Mark[1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                      ,0x25d,"int Abs_GiaCofPrint(word *, int, int, int)");
      }
      Mark[0] = 0;
      Mark[1] = 0;
    }
    Mark[(*(uint *)((long)pTruth + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) != 0] = 1;
    printf("%d");
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int Abs_GiaCofPrint( word * pTruth, int nSize, int nSize0, int Res )
{
    int i, Bit;
    int nBits = (1 << nSize);
    int nStep = (1 << nSize0);
    int Mark[2] = {1,1};
    for ( i = 0; i < nBits; i++ )
    {
        if ( i % nStep == 0 )
        {
            printf( " " );
            assert( Res || (Mark[0] && Mark[1]) );
            Mark[0] = Mark[1] = 0;
        }
        Bit = Abc_InfoHasBit((unsigned *)pTruth, i);
        Mark[Bit] = 1;
        printf( "%d", Bit );
    }
    printf( "\n" );
    assert( Res || (Mark[0] && Mark[1]) );
    return 1;
}